

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiStreamParser.cpp
# Opt level: O2

void __thiscall
MT32Emu::MidiStreamParserImpl::processShortMessage(MidiStreamParserImpl *this,Bit32u message)

{
  bool bVar1;
  _func_int *UNRECOVERED_JUMPTABLE;
  ulong uVar2;
  MidiReceiver *pMVar3;
  Bit8u status;
  byte local_11;
  
  uVar2 = (ulong)message;
  local_11 = (byte)message;
  if ((~message & 0xf8) == 0) {
    pMVar3 = this->midiReceiver;
    UNRECOVERED_JUMPTABLE = pMVar3->_vptr_MidiReceiver[2];
    uVar2 = uVar2 & 0xff;
  }
  else {
    bVar1 = processStatusByte(this,&local_11);
    if (bVar1) {
      pMVar3 = this->midiReceiver;
      uVar2 = (ulong)((uint)local_11 | message << 8);
      UNRECOVERED_JUMPTABLE = *pMVar3->_vptr_MidiReceiver;
    }
    else {
      if (-1 < (char)local_11) {
        return;
      }
      pMVar3 = this->midiReceiver;
      UNRECOVERED_JUMPTABLE = *pMVar3->_vptr_MidiReceiver;
    }
  }
  (*UNRECOVERED_JUMPTABLE)(pMVar3,uVar2);
  return;
}

Assistant:

void MidiStreamParserImpl::processShortMessage(const Bit32u message) {
	// Adds running status to the MIDI message if it doesn't contain one
	Bit8u status = Bit8u(message & 0xFF);
	if (0xF8 <= status) {
		midiReceiver.handleSystemRealtimeMessage(status);
	} else if (processStatusByte(status)) {
		midiReceiver.handleShortMessage((message << 8) | status);
	} else if (0x80 <= status) { // If no running status available yet, skip this message
		midiReceiver.handleShortMessage(message);
	}
}